

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::mousePressEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  Int IVar1;
  MouseButton MVar2;
  QFlagsStorage<QAbstractSpinBox::StepEnabledFlag> QVar3;
  Int IVar4;
  QAbstractSpinBoxPrivate *this_00;
  socklen_t *__addr_len;
  sockaddr *__addr;
  int __fd;
  QPoint *in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QAbstractSpinBoxPrivate *d;
  StepEnabled se;
  StepEnabledFlag in_stack_ffffffffffffff9c;
  StepEnabledFlag other;
  QInputEvent *in_stack_ffffffffffffffa0;
  QAbstractSpinBoxPrivate *this_01;
  QAbstractSpinBoxPrivate *this_02;
  QFlags local_34 [2];
  bool fromKeyboard;
  bool up;
  undefined4 uVar6;
  QPoint local_14;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = d_func((QAbstractSpinBox *)0x68a01f);
  local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorage<Qt::KeyboardModifier>)QInputEvent::modifiers(in_stack_ffffffffffffffa0);
  __addr_len = (socklen_t *)(ulong)(uint)local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i;
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (Int)local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i;
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
  if ((MVar2 == LeftButton) && (this_00->buttonState == 0)) {
    this_01 = this_00;
    QSinglePointEvent::position((QSinglePointEvent *)0x68a081);
    local_14 = QPointF::toPoint((QPointF *)this_01);
    __fd = (int)&local_14;
    QAbstractSpinBoxPrivate::updateHoverControl(this_02,in_RSI);
    QEvent::accept((QEvent *)in_RSI,__fd,__addr,__addr_len);
    uVar6 = 0xaaaaaaaa;
    if (this_01->buttonSymbols == NoButtons) {
      QFlags<QAbstractSpinBox::StepEnabledFlag>::QFlags
                ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)this_00,in_stack_ffffffffffffff9c);
    }
    else {
      uVar6 = (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1c8))();
    }
    QVar3.i = (Int)QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                             ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)this_00,
                              in_stack_ffffffffffffff9c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffd0);
    IVar1 = _local_34;
    other = in_stack_ffffffffffffff9c & 0xffffff;
    if (IVar4 != 0) {
      other = CONCAT13(this_01->hoverControl == SC_ComboBoxFrame,(int3)in_stack_ffffffffffffff9c);
    }
    if ((char)(other >> 0x18) == '\0') {
      _local_34 = (Int)QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                                 ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)this_00,other);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int(local_34);
      bVar5 = false;
      if (IVar4 != 0) {
        bVar5 = this_01->hoverControl == SC_ComboBoxEditField;
      }
      if (bVar5) {
        QAbstractSpinBoxPrivate::updateState
                  ((QAbstractSpinBoxPrivate *)CONCAT44(uVar6,QVar3.i),up,fromKeyboard);
      }
      else {
        QEvent::ignore((QEvent *)in_RSI);
      }
    }
    else {
      up = SUB41(_local_34 >> 0x18,0);
      fromKeyboard = SUB41(IVar1 >> 0x10,0);
      QAbstractSpinBoxPrivate::updateState
                ((QAbstractSpinBoxPrivate *)CONCAT44(uVar6,QVar3.i),up,fromKeyboard);
      _local_34 = IVar1;
    }
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::mousePressEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    if (event->button() != Qt::LeftButton || d->buttonState != None) {
        event->ignore();
        return;
    }

    d->updateHoverControl(event->position().toPoint());
    event->accept();

    const StepEnabled se = (d->buttonSymbols == NoButtons) ? StepEnabled(StepNone) : stepEnabled();
    if ((se & StepUpEnabled) && d->hoverControl == QStyle::SC_SpinBoxUp) {
        d->updateState(true);
    } else if ((se & StepDownEnabled) && d->hoverControl == QStyle::SC_SpinBoxDown) {
        d->updateState(false);
    } else {
        event->ignore();
    }
}